

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiWindowSettings * ImGui::CreateNewWindowSettings(char *name)

{
  uint uVar1;
  int *piVar2;
  undefined8 *puVar3;
  int iVar4;
  ImGuiWindowSettings *pIVar5;
  ImGuiContext *pIVar6;
  ImU32 IVar7;
  ImGuiWindowSettings *pIVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  ImGuiContext *ctx;
  
  pIVar6 = GImGui;
  iVar11 = (GImGui->SettingsWindows).Size;
  iVar4 = (GImGui->SettingsWindows).Capacity;
  if (iVar11 == iVar4) {
    iVar11 = iVar11 + 1;
    if (iVar4 == 0) {
      iVar10 = 8;
    }
    else {
      iVar10 = iVar4 / 2 + iVar4;
    }
    if (iVar11 < iVar10) {
      iVar11 = iVar10;
    }
    if (iVar4 < iVar11) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + 1;
      }
      pIVar8 = (ImGuiWindowSettings *)
               (*GImAllocatorAllocFunc)((long)iVar11 << 5,GImAllocatorUserData);
      pIVar5 = (pIVar6->SettingsWindows).Data;
      if (pIVar5 != (ImGuiWindowSettings *)0x0) {
        memcpy(pIVar8,pIVar5,(long)(pIVar6->SettingsWindows).Size << 5);
        pIVar5 = (pIVar6->SettingsWindows).Data;
        if ((pIVar5 != (ImGuiWindowSettings *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar2 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar2 = *piVar2 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      }
      (pIVar6->SettingsWindows).Data = pIVar8;
      (pIVar6->SettingsWindows).Capacity = iVar11;
    }
  }
  pIVar5 = (pIVar6->SettingsWindows).Data;
  iVar11 = (pIVar6->SettingsWindows).Size;
  puVar3 = (undefined8 *)((long)&pIVar5[iVar11].Pos.x + 1);
  *puVar3 = 0;
  puVar3[1] = 0;
  pIVar5 = pIVar5 + iVar11;
  pIVar5->Name = (char *)0x0;
  pIVar5->ID = 0;
  (pIVar5->Pos).x = 0.0;
  iVar11 = (pIVar6->SettingsWindows).Size;
  uVar1 = iVar11 + 1;
  (pIVar6->SettingsWindows).Size = uVar1;
  if (-1 < iVar11) {
    pIVar5 = (pIVar6->SettingsWindows).Data;
    pIVar8 = pIVar5 + ((ulong)uVar1 - 1);
    pcVar9 = strstr(name,"###");
    if (pcVar9 != (char *)0x0) {
      name = pcVar9;
    }
    pcVar9 = ImStrdup(name);
    pIVar8->Name = pcVar9;
    IVar7 = ImHashStr(name,0,0);
    pIVar5[(ulong)uVar1 - 1].ID = IVar7;
    return pIVar8;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                ,0x4e2,"T &ImVector<ImGuiWindowSettings>::back() [T = ImGuiWindowSettings]");
}

Assistant:

ImGuiWindowSettings* ImGui::CreateNewWindowSettings(const char* name)
{
    ImGuiContext& g = *GImGui;
    g.SettingsWindows.push_back(ImGuiWindowSettings());
    ImGuiWindowSettings* settings = &g.SettingsWindows.back();
#if !IMGUI_DEBUG_INI_SETTINGS
    // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
    // Preserve the full string when IMGUI_DEBUG_INI_SETTINGS is set to make .ini inspection easier.
    if (const char* p = strstr(name, "###"))
        name = p;
#endif
    settings->Name = ImStrdup(name);
    settings->ID = ImHashStr(name);
    return settings;
}